

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclCon.h
# Opt level: O0

void Scl_ConWrite(Scl_Con_t *p,char *pFileName)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  float fVar4;
  FILE *local_38;
  FILE *pFile;
  int i;
  int Value;
  char *pName;
  char *pFileName_local;
  Scl_Con_t *p_local;
  
  if (pFileName == (char *)0x0) {
    local_38 = _stdout;
  }
  else {
    local_38 = fopen(pFileName,"wb");
  }
  if (local_38 == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
  }
  else {
    fprintf(local_38,".model %s\n",p->pModelName);
    if (p->pInCellDef != (char *)0x0) {
      fprintf(local_38,".default_%s %s\n","input_cell",p->pInCellDef);
    }
    if (p->tInArrDef != 0) {
      fVar4 = Scl_Int2Flt(p->tInArrDef);
      fprintf(local_38,".default_%s %.2f\n",(double)fVar4,"input_arrival");
    }
    if (p->tInSlewDef != 0) {
      fVar4 = Scl_Int2Flt(p->tInSlewDef);
      fprintf(local_38,".default_%s %.2f\n",(double)fVar4,"input_slew");
    }
    if (p->tInLoadDef != 0) {
      fVar4 = Scl_Int2Flt(p->tInLoadDef);
      fprintf(local_38,".default_%s %.2f\n",(double)fVar4,"input_load");
    }
    if (p->tOutReqDef != 0) {
      fVar4 = Scl_Int2Flt(p->tOutReqDef);
      fprintf(local_38,".default_%s %.2f\n",(double)fVar4,"output_required");
    }
    if (p->tOutLoadDef != 0) {
      fVar4 = Scl_Int2Flt(p->tOutLoadDef);
      fprintf(local_38,".default_%s %.2f\n",(double)fVar4,"output_load");
    }
    for (pFile._0_4_ = 0; iVar1 = Vec_PtrSize(&p->vInCells), (int)pFile < iVar1;
        pFile._0_4_ = (int)pFile + 1) {
      pcVar2 = (char *)Vec_PtrEntry(&p->vInCells,(int)pFile);
      if ((pcVar2 != (char *)0x0) &&
         ((p->pInCellDef == (char *)0x0 || (iVar1 = strcmp(pcVar2,p->pInCellDef), iVar1 != 0)))) {
        pcVar3 = Abc_NamStr(p->pNamI,(int)pFile + 1);
        fprintf(local_38,".%s %s %s\n","input_cell",pcVar3,pcVar2);
      }
    }
    for (pFile._0_4_ = 0; iVar1 = Vec_IntSize(&p->vInArrs), (int)pFile < iVar1;
        pFile._0_4_ = (int)pFile + 1) {
      iVar1 = Vec_IntEntry(&p->vInArrs,(int)pFile);
      if (iVar1 != p->tInArrDef) {
        pcVar2 = Abc_NamStr(p->pNamI,(int)pFile + 1);
        fVar4 = Scl_Int2Flt(iVar1);
        fprintf(local_38,".%s %s %.2f\n",(double)fVar4,"input_arrival",pcVar2);
      }
    }
    for (pFile._0_4_ = 0; iVar1 = Vec_IntSize(&p->vInSlews), (int)pFile < iVar1;
        pFile._0_4_ = (int)pFile + 1) {
      iVar1 = Vec_IntEntry(&p->vInSlews,(int)pFile);
      if (iVar1 != p->tInSlewDef) {
        pcVar2 = Abc_NamStr(p->pNamI,(int)pFile + 1);
        fVar4 = Scl_Int2Flt(iVar1);
        fprintf(local_38,".%s %s %.2f\n",(double)fVar4,"input_slew",pcVar2);
      }
    }
    for (pFile._0_4_ = 0; iVar1 = Vec_IntSize(&p->vInLoads), (int)pFile < iVar1;
        pFile._0_4_ = (int)pFile + 1) {
      iVar1 = Vec_IntEntry(&p->vInLoads,(int)pFile);
      if (iVar1 != p->tInLoadDef) {
        pcVar2 = Abc_NamStr(p->pNamI,(int)pFile + 1);
        fVar4 = Scl_Int2Flt(iVar1);
        fprintf(local_38,".%s %s %.2f\n",(double)fVar4,"input_load",pcVar2);
      }
    }
    for (pFile._0_4_ = 0; iVar1 = Vec_IntSize(&p->vOutReqs), (int)pFile < iVar1;
        pFile._0_4_ = (int)pFile + 1) {
      iVar1 = Vec_IntEntry(&p->vOutReqs,(int)pFile);
      if (iVar1 != p->tOutReqDef) {
        pcVar2 = Abc_NamStr(p->pNamO,(int)pFile + 1);
        fVar4 = Scl_Int2Flt(iVar1);
        fprintf(local_38,".%s %s %.2f\n",(double)fVar4,"output_required",pcVar2);
      }
    }
    for (pFile._0_4_ = 0; iVar1 = Vec_IntSize(&p->vOutLoads), (int)pFile < iVar1;
        pFile._0_4_ = (int)pFile + 1) {
      iVar1 = Vec_IntEntry(&p->vOutLoads,(int)pFile);
      if (iVar1 != p->tOutLoadDef) {
        pcVar2 = Abc_NamStr(p->pNamO,(int)pFile + 1);
        fVar4 = Scl_Int2Flt(iVar1);
        fprintf(local_38,".%s %s %.2f\n",(double)fVar4,"output_load",pcVar2);
      }
    }
    if (local_38 != _stdout) {
      fclose(local_38);
    }
  }
  return;
}

Assistant:

static inline void Scl_ConWrite( Scl_Con_t * p, char * pFileName )
{
    char * pName; int Value; int i;
    FILE * pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, ".model %s\n", p->pModelName );

    if ( p->pInCellDef )        fprintf( pFile, ".default_%s %s\n",   SCL_INPUT_CELL,  p->pInCellDef );
    if ( p->tInArrDef   != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_ARR,   Scl_Int2Flt(p->tInArrDef) );
    if ( p->tInSlewDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_SLEW,  Scl_Int2Flt(p->tInSlewDef) );
    if ( p->tInLoadDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_INPUT_LOAD,  Scl_Int2Flt(p->tInLoadDef) );
    if ( p->tOutReqDef  != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_OUTPUT_REQ,  Scl_Int2Flt(p->tOutReqDef) );
    if ( p->tOutLoadDef != 0 )  fprintf( pFile, ".default_%s %.2f\n", SCL_OUTPUT_LOAD, Scl_Int2Flt(p->tOutLoadDef) );

    Vec_PtrForEachEntry(char *, &p->vInCells, pName, i) if ( pName && (!p->pInCellDef || strcmp(pName,p->pInCellDef)) )  fprintf( pFile, ".%s %s %s\n",   SCL_INPUT_CELL,  Abc_NamStr(p->pNamI, i+1), pName );
    Vec_IntForEachEntry( &p->vInArrs, Value, i )        if ( Value != p->tInArrDef )   fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_ARR,   Abc_NamStr(p->pNamI, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vInSlews, Value, i )       if ( Value != p->tInSlewDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_SLEW,  Abc_NamStr(p->pNamI, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vInLoads, Value, i )       if ( Value != p->tInLoadDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_INPUT_LOAD,  Abc_NamStr(p->pNamI, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vOutReqs, Value, i )       if ( Value != p->tOutReqDef )  fprintf( pFile, ".%s %s %.2f\n", SCL_OUTPUT_REQ,  Abc_NamStr(p->pNamO, i+1), Scl_Int2Flt(Value) );
    Vec_IntForEachEntry( &p->vOutLoads, Value, i )      if ( Value != p->tOutLoadDef ) fprintf( pFile, ".%s %s %.2f\n", SCL_OUTPUT_LOAD, Abc_NamStr(p->pNamO, i+1), Scl_Int2Flt(Value) );

    if ( pFile != stdout )
        fclose ( pFile );
}